

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar2;
  string_view sVar3;
  bool bVar4;
  ModuleDefinitionInfo *pMVar5;
  string *psVar6;
  reference pbVar7;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *this_02;
  reference ppcVar8;
  ostream *poVar9;
  cmOutputConverter *pcVar10;
  cmSourceFile *src;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  string *obj_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string *obj;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmGeneratedFileStream fout;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  const_iterator local_258;
  string_view local_250;
  string local_240;
  string *local_220;
  allocator<char> local_211;
  string local_210;
  cmValue local_1f0;
  cmValue nm_executable;
  string local_1b8;
  undefined1 local_198 [8];
  string objlist_file;
  string local_170;
  string_view local_150;
  string local_140;
  cmAlphaNum local_120;
  string_view local_f0;
  string local_e0;
  cmAlphaNum local_c0;
  string local_90;
  undefined1 local_70 [8];
  string cmd;
  string local_40;
  ModuleDefinitionInfo *local_20;
  ModuleDefinitionInfo *mdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *real_link_commands_local;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  mdi = (ModuleDefinitionInfo *)real_link_commands;
  real_link_commands_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  GetConfigName_abi_cxx11_(&local_40,this);
  pMVar5 = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((pMVar5 != (ModuleDefinitionInfo *)0x0) && ((pMVar5->DefFileGenerated & 1U) != 0)) {
    local_20 = pMVar5;
    psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::string((string *)local_70,(string *)psVar6);
    pcVar1 = this->LocalGenerator;
    local_f0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_e0,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,local_f0,SHELL);
    cmAlphaNum::cmAlphaNum(&local_c0,&local_e0);
    cmAlphaNum::cmAlphaNum(&local_120," -E __create_def ");
    pcVar10 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    cmOutputConverter::MaybeRelativeToCurBinDir(&local_170,pcVar10,&local_20->DefFile);
    local_150 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_170);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_140,pcVar10,local_150,SHELL);
    objlist_file.field_2._M_local_buf[0xf] = ' ';
    cmStrCat<std::__cxx11::string,char>
              (&local_90,&local_c0,&local_120,&local_140,objlist_file.field_2._M_local_buf + 0xf);
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   &local_20->DefFile,".objs");
    pcVar10 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)&nm_executable,pcVar10,(string *)local_198);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&nm_executable);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_1b8,pcVar10,sVar3,SHELL);
    std::__cxx11::string::operator+=((string *)local_70,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&nm_executable);
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"CMAKE_NM",&local_211);
    local_1f0 = cmMakefile::GetDefinition(this_01,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    local_220 = local_1f0.Value;
    bVar4 = cmNonempty(local_1f0);
    if (bVar4) {
      std::__cxx11::string::operator+=((string *)local_70," --nm=");
      pcVar2 = (this->super_cmCommonTargetGenerator).LocalCommonGenerator;
      psVar6 = cmValue::operator*[abi_cxx11_(&local_1f0);
      local_250 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_240,&(pcVar2->super_cmLocalGenerator).super_cmOutputConverter,local_250,
                 SHELL);
      std::__cxx11::string::operator+=((string *)local_70,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
    }
    pMVar5 = mdi;
    local_260._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)mdi);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_258,&local_260);
    fout._608_8_ = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pMVar5,local_258,(value_type *)local_70);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&__range2,(string *)local_198,false,None);
    if ((local_20->WindowsExportAllSymbols & 1U) != 0) {
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->Objects);
      obj = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->Objects);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&obj);
        if (!bVar4) break;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        sVar3 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar7);
        bVar4 = cmHasLiteralSuffix<5ul>(sVar3,(char (*) [5])".obj");
        if (bVar4) {
          poVar9 = std::operator<<((ostream *)&__range2,(string *)pbVar7);
          std::operator<<(poVar9,"\n");
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->ExternalObjects);
      obj_1 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->ExternalObjects);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&obj_1);
        if (!bVar4) break;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2_1);
        poVar9 = std::operator<<((ostream *)&__range2,(string *)pbVar7);
        std::operator<<(poVar9,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
    }
    this_02 = &local_20->Sources;
    __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       (this_02);
    src = (cmSourceFile *)
          std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end(this_02);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                  *)&src);
      if (!bVar4) break;
      ppcVar8 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&__end1);
      psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar8);
      poVar9 = std::operator<<((ostream *)&__range2,(string *)psVar6);
      std::operator<<(poVar9,"\n");
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end1);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range2);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd = cmStrCat(
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL),
    " -E __create_def ",
    this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(mdi->DefFile),
      cmOutputConverter::SHELL),
    ' ');
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeRelativeToCurBinDir(objlist_file),
    cmOutputConverter::SHELL);
  cmValue nm_executable = this->Makefile->GetDefinition("CMAKE_NM");
  if (cmNonempty(nm_executable)) {
    cmd += " --nm=";
    cmd += this->LocalCommonGenerator->ConvertToOutputFormat(
      *nm_executable, cmOutputConverter::SHELL);
  }
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file);

  if (mdi->WindowsExportAllSymbols) {
    for (std::string const& obj : this->Objects) {
      if (cmHasLiteralSuffix(obj, ".obj")) {
        fout << obj << "\n";
      }
    }
    for (std::string const& obj : this->ExternalObjects) {
      fout << obj << "\n";
    }
  }

  for (cmSourceFile const* src : mdi->Sources) {
    fout << src->GetFullPath() << "\n";
  }
}